

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml_load_mmap.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostream *poVar1;
  MemoryInput input;
  xml_parse_result result;
  xml_document doc;
  MemoryInput local_108;
  xml_parse_result local_f0;
  xml_document local_d8;
  
  if (1 < argc) {
    MemoryInput::MemoryInput(&local_108,argv[1]);
    pugi::xml_document::xml_document(&local_d8);
    std::chrono::_V2::system_clock::now();
    pugi::xml_document::load_buffer
              (&local_f0,&local_d8,local_108._buffer,local_108._size,0x74,encoding_auto);
    std::chrono::_V2::system_clock::now();
    poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    pugi::xml_document::~xml_document(&local_d8);
    local_108._vptr_MemoryInput = (_func_int **)&PTR__MemoryInput_00124ba0;
    if (local_108._buffer != (void *)0x0) {
      munmap(local_108._buffer,local_108._size);
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    if (argc < 2) return 0;
    MemoryInput input(argv[1]);

    pugi::xml_document doc;

    using namespace std::chrono;

    auto start = high_resolution_clock::now();

    pugi::xml_parse_result result = doc.load_buffer(input.buffer(), input.size());

    auto end = high_resolution_clock::now();;

    std::cout << duration_cast<milliseconds>(end - start).count() << std::endl;
}